

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

int Aig_ManCountReprs(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < p->vObjs->nSize; lVar3 = lVar3 + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,(int)lVar3);
      if (pvVar1 != (void *)0x0) {
        iVar2 = (iVar2 + 1) - (uint)(p->pReprs[lVar3] == (Aig_Obj_t *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int Aig_ManCountReprs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    Aig_ManForEachObj( p, pObj, i )
        Counter += (p->pReprs[i] != NULL);
    return Counter;
}